

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_ls.c
# Opt level: O0

int kinLsDenseDQJac(N_Vector u,N_Vector fu,SUNMatrix Jac,KINMem kin_mem,N_Vector tmp1,N_Vector tmp2)

{
  double dVar1;
  long lVar2;
  sunindextype sVar3;
  undefined8 uVar4;
  long lVar5;
  long lVar6;
  sunrealtype *psVar7;
  long in_RCX;
  SUNMatrix in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  double dVar8;
  int retval;
  KINLsMem kinls_mem;
  sunindextype N;
  sunindextype j;
  N_Vector jthCol;
  N_Vector ftemp;
  sunrealtype *uscale_data;
  sunrealtype *u_data;
  sunrealtype *tmp2_data;
  sunrealtype sign;
  sunrealtype ujscale;
  sunrealtype ujsaved;
  sunrealtype inc_inv;
  sunrealtype inc;
  double local_b0;
  int local_9c;
  long local_88;
  
  local_9c = 0;
  lVar2 = *(long *)(in_RCX + 0x248);
  sVar3 = SUNDenseMatrix_Columns(in_RDX);
  uVar4 = N_VGetArrayPointer(in_R9);
  lVar5 = N_VGetArrayPointer(in_RDI);
  lVar6 = N_VGetArrayPointer(*(undefined8 *)(in_RCX + 0x128));
  for (local_88 = 0; local_88 < sVar3; local_88 = local_88 + 1) {
    psVar7 = SUNDenseMatrix_Column(in_RDX,local_88);
    N_VSetArrayPointer(psVar7,in_R9);
    dVar1 = *(double *)(lVar5 + local_88 * 8);
    local_b0 = 1.0 / *(double *)(lVar6 + local_88 * 8);
    if (local_b0 < ABS(dVar1)) {
      local_b0 = ABS(dVar1);
    }
    dVar8 = *(double *)(in_RCX + 0x88) * local_b0 *
            (double)(~-(ulong)(0.0 <= dVar1) & 0xbff0000000000000 |
                    -(ulong)(0.0 <= dVar1) & 0x3ff0000000000000);
    *(double *)(lVar5 + local_88 * 8) = dVar8 + *(double *)(lVar5 + local_88 * 8);
    local_9c = (**(code **)(in_RCX + 0x10))(in_RDI,in_R8,*(undefined8 *)(in_RCX + 0x18));
    *(long *)(lVar2 + 0x40) = *(long *)(lVar2 + 0x40) + 1;
    if (local_9c != 0) break;
    *(double *)(lVar5 + local_88 * 8) = dVar1;
    dVar8 = 1.0 / dVar8;
    N_VLinearSum(dVar8,-dVar8,in_R8,in_RSI,in_R9);
  }
  N_VSetArrayPointer(uVar4,in_R9);
  return local_9c;
}

Assistant:

int kinLsDenseDQJac(N_Vector u, N_Vector fu, SUNMatrix Jac, KINMem kin_mem,
                    N_Vector tmp1, N_Vector tmp2)
{
  sunrealtype inc, inc_inv, ujsaved, ujscale, sign;
  sunrealtype *tmp2_data, *u_data, *uscale_data;
  N_Vector ftemp, jthCol;
  sunindextype j, N;
  KINLsMem kinls_mem;
  int retval = 0;

  /* access LsMem interface structure */
  kinls_mem = (KINLsMem)kin_mem->kin_lmem;

  /* access matrix dimension */
  N = SUNDenseMatrix_Columns(Jac);

  /* Save pointer to the array in tmp2 */
  tmp2_data = N_VGetArrayPointer(tmp2);

  /* Rename work vectors for readibility */
  ftemp  = tmp1;
  jthCol = tmp2;

  /* Obtain pointers to the data for u and uscale */
  u_data      = N_VGetArrayPointer(u);
  uscale_data = N_VGetArrayPointer(kin_mem->kin_uscale);

  /* This is the only for loop for 0..N-1 in KINSOL */

  for (j = 0; j < N; j++)
  {
    /* Generate the jth col of J(u) */

    /* Set data address of jthCol, and save u_j values and scaling */
    N_VSetArrayPointer(SUNDenseMatrix_Column(Jac, j), jthCol);
    ujsaved = u_data[j];
    ujscale = ONE / uscale_data[j];

    /* Compute increment */
    sign = (ujsaved >= ZERO) ? ONE : -ONE;
    inc  = kin_mem->kin_sqrt_relfunc * SUNMAX(SUNRabs(ujsaved), ujscale) * sign;

    /* Increment u_j, call F(u), and return if error occurs */
    u_data[j] += inc;

    retval = kin_mem->kin_func(u, ftemp, kin_mem->kin_user_data);
    kinls_mem->nfeDQ++;
    if (retval != 0) { break; }

    /* reset u_j */
    u_data[j] = ujsaved;

    /* Construct difference quotient in jthCol */
    inc_inv = ONE / inc;
    N_VLinearSum(inc_inv, ftemp, -inc_inv, fu, jthCol);
  }

  /* Restore original array pointer in tmp2 */
  N_VSetArrayPointer(tmp2_data, tmp2);

  return (retval);
}